

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O2

void __thiscall
helics::CommsInterface::setCallback
          (CommsInterface *this,function<void_(helics::ActionMessage_&&)> *callback)

{
  bool bVar1;
  
  bVar1 = propertyLock(this);
  if (bVar1) {
    std::function<void_(helics::ActionMessage_&&)>::operator=(&this->ActionCallback,callback);
    propertyUnLock(this);
    return;
  }
  return;
}

Assistant:

void CommsInterface::setCallback(std::function<void(ActionMessage&&)> callback)
{
    if (propertyLock()) {
        ActionCallback = std::move(callback);
        propertyUnLock();
    }
}